

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QMap<int,QVariant>>::emplace<QMap<int,QVariant>const&>
          (QMovableArrayOps<QMap<int,QVariant>> *this,qsizetype i,QMap<int,_QVariant> *args)

{
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  qsizetype qVar2;
  long lVar3;
  long in_FS_OFFSET;
  Inserter local_58;
  QMap<int,_QVariant> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar2 = QArrayDataPointer<QMap<int,_QVariant>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<QMap<int,_QVariant>_> *)this);
      if (qVar2 != 0) {
        lVar3 = *(long *)(this + 0x10);
        pQVar1 = (args->d).d.ptr;
        *(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
          **)(*(long *)(this + 8) + lVar3 * 8) = pQVar1;
        if (pQVar1 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                       *)0x0) {
          LOCK();
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                                 super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
          lVar3 = *(long *)(this + 0x10);
        }
        *(long *)(this + 0x10) = lVar3 + 1;
        goto LAB_003fe4c0;
      }
    }
    if (i == 0) {
      qVar2 = QArrayDataPointer<QMap<int,_QVariant>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<QMap<int,_QVariant>_> *)this);
      if (qVar2 != 0) {
        pQVar1 = (args->d).d.ptr;
        *(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
          **)(*(long *)(this + 8) + -8) = pQVar1;
        if (pQVar1 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                       *)0x0) {
          LOCK();
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                                 super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
        }
        *(long *)(this + 8) = *(long *)(this + 8) + -8;
        *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
        goto LAB_003fe4c0;
      }
    }
  }
  local_30 = (QMap<int,_QVariant>)(args->d).d.ptr;
  if (local_30.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_30.d.d.ptr = *(int *)local_30.d.d.ptr + 1;
    UNLOCK();
  }
  lVar3 = *(long *)(this + 0x10);
  QArrayDataPointer<QMap<int,_QVariant>_>::detachAndGrow
            ((QArrayDataPointer<QMap<int,_QVariant>_> *)this,(uint)(i == 0 && lVar3 != 0),1,
             (QMap<int,_QVariant> **)0x0,(QArrayDataPointer<QMap<int,_QVariant>_> *)0x0);
  if (i == 0 && lVar3 != 0) {
    ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      *)(*(long *)(this + 8) + -8))->d =
         (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
          )local_30.d.d.ptr;
    *(long *)(this + 8) = *(long *)(this + 8) + -8;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<QMap<int,_QVariant>_>::Inserter::Inserter
              (&local_58,(QArrayDataPointer<QMap<int,_QVariant>_> *)this,i,1);
    ((local_58.displaceFrom)->d).d.ptr =
         (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
          *)local_30.d.d.ptr;
    local_58.displaceFrom = local_58.displaceFrom + 1;
    (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
  }
  local_30.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
          )0x0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30.d);
LAB_003fe4c0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }